

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::
PlainTemplated<duckdb::hugeint_t,duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,false>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainTemplatedInternal<duckdb::hugeint_t,duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,false>,true,false>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  PlainTemplatedInternal<duckdb::hugeint_t,duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,false>,false,false>
            (this,plain_data,defines,num_values,result_offset,result);
  return;
}

Assistant:

void PlainTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                    Vector &result) {
		if (HasDefines() && defines) {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, true>(plain_data, defines, num_values, result_offset, result);
		} else {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, false>(plain_data, defines, num_values, result_offset,
			                                                     result);
		}
	}